

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O3

void h2v1_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  jpeg_upsampler *pjVar4;
  JSAMPLE *pJVar5;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var6;
  long lVar7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  long lVar10;
  JSAMPROW pJVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  uint uVar15;
  byte *pbVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  
  pjVar4 = cinfo->upsample;
  pJVar5 = cinfo->sample_range_limit;
  p_Var6 = pjVar4[1].upsample;
  lVar7 = *(long *)&pjVar4[1].need_context_rows;
  p_Var8 = pjVar4[2].start_pass;
  p_Var9 = pjVar4[2].upsample;
  pbVar12 = (*input_buf)[in_row_group_ctr];
  pbVar14 = input_buf[1][in_row_group_ctr];
  pbVar16 = input_buf[2][in_row_group_ctr];
  pJVar11 = *output_buf;
  uVar15 = cinfo->output_width;
  if (1 < uVar15) {
    uVar15 = uVar15 >> 1;
    do {
      bVar1 = *pbVar14;
      pbVar14 = pbVar14 + 1;
      bVar2 = *pbVar16;
      pbVar16 = pbVar16 + 1;
      lVar18 = (long)*(int *)(p_Var6 + (ulong)bVar2 * 4);
      lVar17 = *(long *)(p_Var8 + (ulong)bVar2 * 8);
      lVar10 = *(long *)(p_Var9 + (ulong)bVar1 * 8);
      lVar19 = (long)*(int *)(lVar7 + (ulong)bVar1 * 4);
      uVar13 = (ulong)*pbVar12;
      *pJVar11 = pJVar5[lVar18 + uVar13];
      lVar17 = (long)(int)((ulong)(lVar17 + lVar10) >> 0x10);
      pJVar11[1] = pJVar5[lVar17 + uVar13];
      pJVar11[2] = pJVar5[uVar13 + lVar19];
      uVar13 = (ulong)pbVar12[1];
      pbVar12 = pbVar12 + 2;
      pJVar11[3] = pJVar5[lVar18 + uVar13];
      pJVar11[4] = pJVar5[lVar17 + uVar13];
      pJVar11[5] = pJVar5[lVar19 + uVar13];
      pJVar11 = pJVar11 + 6;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    uVar15 = cinfo->output_width;
  }
  if ((uVar15 & 1) != 0) {
    lVar17 = *(long *)(p_Var8 + (ulong)*pbVar16 * 8);
    lVar10 = *(long *)(p_Var9 + (ulong)*pbVar14 * 8);
    iVar3 = *(int *)(lVar7 + (ulong)*pbVar14 * 4);
    uVar13 = (ulong)*pbVar12;
    *pJVar11 = pJVar5[(long)*(int *)(p_Var6 + (ulong)*pbVar16 * 4) + uVar13];
    pJVar11[1] = pJVar5[(long)(int)((ulong)(lVar17 + lVar10) >> 0x10) + uVar13];
    pJVar11[2] = pJVar5[(long)iVar3 + uVar13];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample (j_decompress_ptr cinfo,
		      JSAMPIMAGE input_buf, JDIMENSION in_row_group_ctr,
		      JSAMPARRAY output_buf)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  register int y, cred, cgreen, cblue;
  int cb, cr;
  register JSAMPROW outptr;
  JSAMPROW inptr0, inptr1, inptr2;
  JDIMENSION col;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  int * Crrtab = upsample->Cr_r_tab;
  int * Cbbtab = upsample->Cb_b_tab;
  INT32 * Crgtab = upsample->Cr_g_tab;
  INT32 * Cbgtab = upsample->Cb_g_tab;
  SHIFT_TEMPS

  inptr0 = input_buf[0][in_row_group_ctr];
  inptr1 = input_buf[1][in_row_group_ctr];
  inptr2 = input_buf[2][in_row_group_ctr];
  outptr = output_buf[0];
  /* Loop for each pair of output pixels */
  for (col = cinfo->output_width >> 1; col > 0; col--) {
    /* Do the chroma part of the calculation */
    cb = GETJSAMPLE(*inptr1++);
    cr = GETJSAMPLE(*inptr2++);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    /* Fetch 2 Y values and emit 2 pixels */
    y  = GETJSAMPLE(*inptr0++);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
    outptr += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr0++);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
    outptr += RGB_PIXELSIZE;
  }
  /* If image width is odd, do the last output column separately */
  if (cinfo->output_width & 1) {
    cb = GETJSAMPLE(*inptr1);
    cr = GETJSAMPLE(*inptr2);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    y  = GETJSAMPLE(*inptr0);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
  }
}